

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++.cc
# Opt level: O0

Status __thiscall osqp::OsqpSolver::UpdateTimeLimit(OsqpSolver *this,double time_limit_new)

{
  bool bVar1;
  c_int cVar2;
  AlphaNum *in_RCX;
  unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter> *in_RSI;
  string_view message;
  string_view message_00;
  string_view message_01;
  OSQPWorkspace *in_stack_fffffffffffffee8;
  basic_string_view<char,_std::char_traits<char>_> local_e0 [2];
  AlphaNum local_c0;
  AlphaNum local_90;
  string local_60;
  undefined1 local_40 [16];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  double local_20;
  double time_limit_new_local;
  OsqpSolver *this_local;
  
  local_20 = time_limit_new;
  this_local = this;
  bVar1 = IsInitialized((OsqpSolver *)in_RSI);
  if (bVar1) {
    if (0.0 <= local_20) {
      std::unique_ptr<osqp::OSQPWorkspaceHelper,_osqp::OsqpSolver::OsqpDeleter>::get(in_RSI);
      cVar2 = osqp_update_time_limit(in_stack_fffffffffffffee8,8.97475680392729e-318);
      if (cVar2 == 0) {
        absl::OkStatus();
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (local_e0,"osqp_update_time_limit unexpectedly failed.");
        message_01._M_str = (char *)local_e0[0]._M_len;
        message_01._M_len = (size_t)this;
        absl::UnknownError(message_01);
      }
    }
    else {
      absl::AlphaNum::AlphaNum(&local_90,"Invalid time_limit value: ");
      absl::AlphaNum::AlphaNum(&local_c0,local_20);
      absl::StrCat_abi_cxx11_(&local_60,(absl *)&local_90,&local_c0,in_RCX);
      local_40 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_60);
      message_00._M_str = local_40._0_8_;
      message_00._M_len = (size_t)this;
      absl::InvalidArgumentError(message_00);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_30,"OsqpSolver is not initialized.");
    message._M_str = (char *)local_30._M_len;
    message._M_len = (size_t)this;
    absl::FailedPreconditionError(message);
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status OsqpSolver::UpdateTimeLimit(const double time_limit_new) {
  if (!IsInitialized()) {
    return absl::FailedPreconditionError("OsqpSolver is not initialized.");
  }
  if (time_limit_new < 0.0) {
    return absl::InvalidArgumentError(
        absl::StrCat("Invalid time_limit value: ", time_limit_new));
  }
  if (osqp_update_time_limit(workspace_.get(), time_limit_new) != 0) {
    return absl::UnknownError("osqp_update_time_limit unexpectedly failed.");
  }
  return absl::OkStatus();
}